

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

Script * cfd::core::ScriptUtil::CreateP2shLockingScript
                   (Script *__return_storage_ptr__,Script *redeem_script)

{
  undefined1 local_30 [8];
  ByteData160 script_hash;
  Script *redeem_script_local;
  
  script_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)redeem_script;
  HashUtil::Hash160((ByteData160 *)local_30,redeem_script);
  CreateP2shLockingScript(__return_storage_ptr__,(ByteData160 *)local_30);
  ByteData160::~ByteData160((ByteData160 *)0x41dbd4);
  return __return_storage_ptr__;
}

Assistant:

Script ScriptUtil::CreateP2shLockingScript(const Script& redeem_script) {
  // script hash作成
  ByteData160 script_hash = HashUtil::Hash160(redeem_script);

  return CreateP2shLockingScript(script_hash);
}